

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

uint64_t helper_fixb(CPUS390XState_conflict *env,uint64_t ah,uint64_t al,uint32_t m34)

{
  int iVar1;
  float128 fVar2;
  uintptr_t unaff_retaddr;
  
  iVar1 = s390_swap_bfp_rounding_mode(env,m34 & 0xf);
  fVar2.high = ah;
  fVar2.low = al;
  fVar2 = float128_round_to_int_s390x(fVar2,&env->fpu_status);
  (env->fpu_status).float_rounding_mode = (char)iVar1;
  handle_exceptions(env,SUB41((m34 & 0x40) >> 6,0),unaff_retaddr);
  env->retxl = fVar2.low;
  return fVar2.high;
}

Assistant:

uint64_t HELPER(fixb)(CPUS390XState *env, uint64_t ah, uint64_t al,
                      uint32_t m34)
{
    int old_mode = s390_swap_bfp_rounding_mode(env, round_from_m34(m34));
    float128 ret = float128_round_to_int(make_float128(ah, al),
                                         &env->fpu_status);

    s390_restore_bfp_rounding_mode(env, old_mode);
    handle_exceptions(env, xxc_from_m34(m34), GETPC());
    return RET128(ret);
}